

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFrames.c
# Opt level: O3

Aig_Man_t *
Aig_ManFrames(Aig_Man_t *pAig,int nFs,int fInit,int fOuts,int fRegs,int fEnlarge,
             Aig_Obj_t ***ppObjMap)

{
  char *pcVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  Aig_Obj_t **__s;
  Aig_Man_t *p;
  char *pcVar7;
  Aig_Obj_t *pAVar8;
  ulong uVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  Aig_Obj_t *p1;
  uint uVar12;
  int iVar13;
  size_t sVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  long lVar20;
  
  lVar6 = (long)nFs;
  lVar16 = pAig->vObjs->nSize * lVar6;
  sVar14 = lVar16 * 8;
  __s = (Aig_Obj_t **)malloc(sVar14);
  pcVar7 = (char *)0x0;
  memset(__s,0,sVar14);
  p = Aig_ManStart((int)lVar16);
  pcVar1 = pAig->pName;
  if (pcVar1 != (char *)0x0) {
    sVar14 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p->pName = pcVar7;
  pcVar1 = pAig->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar14 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p->pSpec = pcVar7;
  auVar4 = _DAT_0094e250;
  if (0 < nFs) {
    iVar5 = pAig->pConst1->Id * nFs;
    pAVar8 = p->pConst1;
    lVar16 = (ulong)(uint)nFs - 1;
    auVar18._8_4_ = (int)lVar16;
    auVar18._0_8_ = lVar16;
    auVar18._12_4_ = (int)((ulong)lVar16 >> 0x20);
    lVar16 = 0;
    auVar18 = auVar18 ^ _DAT_0094e250;
    auVar19 = _DAT_0094e240;
    do {
      auVar21 = auVar19 ^ auVar4;
      if ((bool)(~(auVar21._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar21._0_4_ ||
                  auVar18._4_4_ < auVar21._4_4_) & 1)) {
        *(Aig_Obj_t **)((long)__s + lVar16 + (long)iVar5 * 8) = pAVar8;
      }
      if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
          auVar21._12_4_ <= auVar18._12_4_) {
        *(Aig_Obj_t **)((long)__s + lVar16 + (long)iVar5 * 8 + 8) = pAVar8;
      }
      lVar20 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar20 + 2;
      lVar16 = lVar16 + 0x10;
    } while ((ulong)(nFs + 1U >> 1) << 4 != lVar16);
    if (0 < nFs) {
      iVar5 = pAig->nRegs;
      iVar13 = pAig->nObjs[2];
      iVar15 = 0;
      do {
        if (iVar5 < iVar13) {
          lVar16 = 0;
          do {
            if (pAig->vCis->nSize <= lVar16) goto LAB_006c5433;
            pvVar2 = pAig->vCis->pArray[lVar16];
            pAVar8 = Aig_ObjCreateCi(p);
            __s[*(int *)((long)pvVar2 + 0x24) * nFs + iVar15] = pAVar8;
            lVar16 = lVar16 + 1;
            iVar5 = pAig->nRegs;
            iVar13 = pAig->nObjs[2];
          } while (lVar16 < iVar13 - iVar5);
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 != nFs);
    }
  }
  uVar12 = pAig->nObjs[2] - pAig->nRegs;
  pVVar10 = pAig->vCis;
  iVar5 = pVVar10->nSize;
  if (fInit == 0) {
    if ((int)uVar12 < iVar5) {
      uVar11 = (ulong)uVar12;
      do {
        if ((int)uVar12 < 0) goto LAB_006c5433;
        pvVar2 = pVVar10->pArray[uVar11];
        pAVar8 = Aig_ObjCreateCi(p);
        __s[*(int *)((long)pvVar2 + 0x24) * lVar6] = pAVar8;
        uVar11 = uVar11 + 1;
        pVVar10 = pAig->vCis;
      } while ((int)uVar11 < pVVar10->nSize);
    }
  }
  else if ((int)uVar12 < iVar5) {
    uVar11 = (ulong)uVar12;
    do {
      if ((int)uVar12 < 0) goto LAB_006c5433;
      __s[*(int *)((long)pVVar10->pArray[uVar11] + 0x24) * lVar6] =
           (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
      uVar11 = uVar11 + 1;
    } while ((int)uVar11 < iVar5);
  }
  if (0 < nFs) {
    pVVar10 = pAig->vObjs;
    iVar5 = 0;
    do {
      if (0 < pVVar10->nSize) {
        lVar6 = 0;
        do {
          pvVar2 = pVVar10->pArray[lVar6];
          if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
            uVar11 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
            if (uVar11 == 0) {
              pAVar8 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar8 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                       (ulong)__s[*(int *)(uVar11 + 0x24) * nFs + iVar5]);
            }
            uVar11 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
            if (uVar11 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^
                   (ulong)__s[*(int *)(uVar11 + 0x24) * nFs + iVar5]);
            }
            pAVar8 = Aig_And(p,pAVar8,p1);
            __s[*(int *)((long)pvVar2 + 0x24) * nFs + iVar5] = pAVar8;
            pVVar10 = pAig->vObjs;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < pVVar10->nSize);
      }
      iVar13 = pAig->nRegs;
      lVar6 = (long)iVar13;
      if (0 < lVar6) {
        pVVar3 = pAig->vCos;
        uVar11 = (ulong)(uint)(pAig->nObjs[3] - iVar13);
        iVar13 = -iVar13;
        do {
          if (((((int)uVar11 < 0) || (pVVar3->nSize <= (int)uVar11)) ||
              (uVar12 = pAig->nObjs[2] + iVar13, (int)uVar12 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar12)) goto LAB_006c5433;
          uVar9 = *(ulong *)((long)pVVar3->pArray[uVar11] + 8);
          uVar17 = uVar9 & 0xfffffffffffffffe;
          if (uVar17 == 0) {
            pAVar8 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar8 = (Aig_Obj_t *)
                     ((ulong)((uint)uVar9 & 1) ^ (ulong)__s[*(int *)(uVar17 + 0x24) * nFs + iVar5]);
          }
          if (iVar5 < nFs + -1) {
            __s[*(int *)((long)pAig->vCis->pArray[uVar12] + 0x24) * nFs + iVar5 + 1] = pAVar8;
          }
          uVar11 = uVar11 + 1;
          iVar13 = iVar13 + 1;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != nFs);
  }
  if (fOuts != 0) {
    iVar5 = nFs + -1;
    if (fEnlarge == 0) {
      iVar5 = 0;
    }
    if (iVar5 < nFs) {
      iVar13 = pAig->nRegs;
      iVar15 = pAig->nObjs[3];
      do {
        if (iVar13 < iVar15) {
          lVar6 = 0;
          do {
            if (pAig->vCos->nSize <= lVar6) goto LAB_006c5433;
            pvVar2 = pAig->vCos->pArray[lVar6];
            uVar11 = *(ulong *)((long)pvVar2 + 8);
            uVar9 = uVar11 & 0xfffffffffffffffe;
            if (uVar9 == 0) {
              pAVar8 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar8 = (Aig_Obj_t *)
                       ((ulong)((uint)uVar11 & 1) ^ (ulong)__s[*(int *)(uVar9 + 0x24) * nFs + iVar5]
                       );
            }
            pAVar8 = Aig_ObjCreateCo(p,pAVar8);
            __s[*(int *)((long)pvVar2 + 0x24) * nFs + iVar5] = pAVar8;
            lVar6 = lVar6 + 1;
            iVar13 = pAig->nRegs;
            iVar15 = pAig->nObjs[3];
          } while (lVar6 < iVar15 - iVar13);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != nFs);
    }
  }
  if (fRegs != 0) {
    iVar5 = pAig->nRegs;
    p->nRegs = iVar5;
    uVar12 = pAig->nObjs[3] - iVar5;
    pVVar10 = pAig->vCos;
    if ((int)uVar12 < pVVar10->nSize) {
      iVar5 = 0;
      if (fEnlarge == 0) {
        iVar5 = nFs + -1;
      }
      uVar11 = (ulong)uVar12;
      do {
        if ((int)uVar12 < 0) {
LAB_006c5433:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar2 = pVVar10->pArray[uVar11];
        uVar9 = *(ulong *)((long)pvVar2 + 8);
        uVar17 = uVar9 & 0xfffffffffffffffe;
        if (uVar17 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)
                   ((ulong)((uint)uVar9 & 1) ^ (ulong)__s[*(int *)(uVar17 + 0x24) * nFs + iVar5]);
        }
        pAVar8 = Aig_ObjCreateCo(p,pAVar8);
        __s[*(int *)((long)pvVar2 + 0x24) * nFs + nFs + -1] = pAVar8;
        uVar11 = uVar11 + 1;
        pVVar10 = pAig->vCos;
      } while ((int)uVar11 < pVVar10->nSize);
      iVar5 = pAig->nRegs;
    }
    Aig_ManSetRegNum(p,iVar5);
  }
  Aig_ManCleanup(p);
  if (ppObjMap == (Aig_Obj_t ***)0x0) {
    if (__s != (Aig_Obj_t **)0x0) {
      free(__s);
    }
  }
  else {
    *ppObjMap = __s;
  }
  return p;
}

Assistant:

Aig_Man_t * Aig_ManFrames( Aig_Man_t * pAig, int nFs, int fInit, int fOuts, int fRegs, int fEnlarge, Aig_Obj_t *** ppObjMap )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f;

    // create mapping for the frames nodes
    pObjMap  = ABC_ALLOC( Aig_Obj_t *, nFs * Aig_ManObjNumMax(pAig) );
    memset( pObjMap, 0, sizeof(Aig_Obj_t *) * nFs * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFs );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFs; f++ )
        Aig_ObjSetFrames( pObjMap, nFs, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFs; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    if ( fInit )
    {
        Aig_ManForEachLoSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, 0, Aig_ManConst0(pFrames) );
    }
    else 
    {
        Aig_ManForEachLoSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, 0, Aig_ObjCreateCi(pFrames) );
    }

    // add timeframes
    for ( f = 0; f < nFs; f++ )
    {
//        printf( "Frame = %d.\n", f );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
        {
//            Aig_Obj_t * pFanin0 = Aig_ObjChild0Frames(pObjMap,nFs,pObj,f);
//            Aig_Obj_t * pFanin1 = Aig_ObjChild1Frames(pObjMap,nFs,pObj,f);
//            printf( "Node = %3d.  Fanin0 = %3d. Fanin1 = %3d.\n", pObj->Id, Aig_Regular(pFanin0)->Id, Aig_Regular(pFanin1)->Id );
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,f), Aig_ObjChild1Frames(pObjMap,nFs,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFs, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFs,pObjLi,f);
            if ( f < nFs - 1 )
                Aig_ObjSetFrames( pObjMap, nFs, pObjLo, f+1, pObjNew );
        }
    }
    if ( fOuts )
    {
        for ( f = fEnlarge?nFs-1:0; f < nFs; f++ )
            Aig_ManForEachPoSeq( pAig, pObj, i )
            {
                pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,f) );
                Aig_ObjSetFrames( pObjMap, nFs, pObj, f, pObjNew );
            }
    }
    if ( fRegs )
    {
        pFrames->nRegs = pAig->nRegs;
        Aig_ManForEachLiSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,fEnlarge?0:nFs-1) );
            Aig_ObjSetFrames( pObjMap, nFs, pObj, nFs-1, pObjNew );
        }
        Aig_ManSetRegNum( pFrames, Aig_ManRegNum(pAig) );
    }
    Aig_ManCleanup( pFrames );
    // return the new manager
    if ( ppObjMap )
        *ppObjMap = pObjMap;
    else
        ABC_FREE( pObjMap );
    return pFrames;
}